

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O2

int dwarf_get_loclist_head_kind(Dwarf_Loc_Head_c ll_header,uint *kind,Dwarf_Error *error)

{
  if (ll_header != (Dwarf_Loc_Head_c)0x0) {
    *kind = (uint)ll_header->ll_lkind;
    return 0;
  }
  _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                      "DW_DLE_DBG_NULL: NULL Dwarf_Loc_Head_c argument passed to dwarf_get_loclist_head_kind()"
                     );
  return 1;
}

Assistant:

int
dwarf_get_loclist_head_kind(Dwarf_Loc_Head_c ll_header,
    unsigned int * kind,
    Dwarf_Error  * error)
{
    if (!ll_header) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: "
            "NULL Dwarf_Loc_Head_c "
            "argument passed to "
            "dwarf_get_loclist_head_kind()");
        return DW_DLV_ERROR;
    }
    *kind = ll_header->ll_lkind;
    return DW_DLV_OK;
}